

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  ostream *poVar2;
  pointer pbVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  char *local_188;
  long local_180;
  char local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"1-normal","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"2-noisy","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"3-blurry","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"4-collapsed","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"5-blurry_noisy","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"6-collapsed_noisy","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"7-collapsed_blurry","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"8-collapsed_blurry_noisy","");
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148,__l,(allocator_type *)local_168);
  lVar4 = 0;
  do {
    if (local_40 + lVar4 != *(undefined1 **)((long)local_50 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x100);
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar3 = local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar1,pcVar1 + pbVar3->_M_string_length);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_188,local_180);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char*>((string *)local_168,local_188,local_188 + local_180)
      ;
      std::__cxx11::string::append((char *)local_168);
      cv::imread((string *)&local_130,(int)(string *)local_168);
      processImage((Mat *)&local_130,*local_188);
      cv::Mat::~Mat((Mat *)&local_130);
      if (local_168[0] != local_158) {
        operator_delete(local_168[0]);
      }
      if (local_188 != local_178) {
        operator_delete(local_188);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != local_148.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return 0;
}

Assistant:

int main() {
    vector<string> files{"1-normal", "2-noisy", "3-blurry", "4-collapsed", "5-blurry_noisy", "6-collapsed_noisy", "7-collapsed_blurry", "8-collapsed_blurry_noisy"};
    auto openAndProcess = [](string name) {cout << name <<endl;processImage(imread(name + ".jpg", 0), name[0]);};
    for_each(files.begin(), files.end(), openAndProcess);
}